

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

DdNode * Extra_zddRandomSet(DdManager *dd,int n,int k,double d)

{
  int *VarValues;
  time_t seed;
  long lVar1;
  DdNode *n_00;
  DdNode *pDVar2;
  int iVar3;
  ulong uVar4;
  DdNode *local_50;
  
  local_50 = (DdNode *)0x0;
  if ((((d <= 1.0) && (0 < n)) && (0 < k)) && (0.0 <= d)) {
    VarValues = (int *)malloc((ulong)(uint)n * 4);
    if (VarValues == (int *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
      local_50 = (DdNode *)0x0;
    }
    else {
      local_50 = dd->zero;
      Cudd_Ref(local_50);
      iVar3 = 0;
      seed = time((time_t *)0x0);
      Cudd_Srandom(seed);
      do {
        uVar4 = 0;
        do {
          lVar1 = Cudd_Random();
          VarValues[uVar4] = (uint)(lVar1 <= (int)(d * 2147483561.0));
          uVar4 = uVar4 + 1;
        } while ((uint)n != uVar4);
        do {
          dd->reordered = 0;
          n_00 = extraZddCombination(dd,VarValues,n);
        } while (dd->reordered == 1);
        Cudd_Ref(n_00);
        if (iVar3 == 0) {
LAB_00822305:
          pDVar2 = Cudd_zddUnion(dd,local_50,n_00);
          Cudd_Ref(pDVar2);
          Cudd_RecursiveDerefZdd(dd,local_50);
          Cudd_RecursiveDerefZdd(dd,n_00);
          iVar3 = iVar3 + 1;
          local_50 = pDVar2;
        }
        else {
          pDVar2 = Cudd_zddDiff(dd,local_50,n_00);
          Cudd_Ref(pDVar2);
          if (pDVar2 == local_50) {
            Cudd_Deref(pDVar2);
            goto LAB_00822305;
          }
          Cudd_RecursiveDerefZdd(dd,pDVar2);
          Cudd_RecursiveDerefZdd(dd,n_00);
        }
      } while (iVar3 < k);
      free(VarValues);
      Cudd_Deref(local_50);
    }
  }
  return local_50;
}

Assistant:

DdNode* Extra_zddRandomSet( 
  DdManager * dd,   /* the DD manager */
  int n,            /* the number of elements */
  int k,            /* the number of combinations (subsets) */
  double d)         /* average density of elements in combinations */
{
    DdNode *Result, *TempComb, *Aux;
    int c, v, Limit, *VarValues;

    /* sanity check the parameters */
    if ( n <= 0 || k <= 0 || d < 0.0 || d > 1.0 )
        return NULL;

    /* allocate temporary storage for variable values */
    VarValues = ABC_ALLOC( int, n );
    if (VarValues == NULL) 
    {
        dd->errorCode = CUDD_MEMORY_OUT;
        return NULL;
    }

    /* start the new set */
    Result = dd->zero;
    Cudd_Ref( Result );

    /* seed random number generator */
    Cudd_Srandom( time(NULL) );
//  Cudd_Srandom( 4 );
    /* determine the limit below which var belongs to the combination */
    Limit = (int)(d * 2147483561.0);

    /* add combinations one by one */
    for ( c = 0; c < k; c++ )
    {
        for ( v = 0; v < n; v++ )
            if ( Cudd_Random() <= Limit )
                VarValues[v] = 1;
            else
                VarValues[v] = 0;

        TempComb = Extra_zddCombination( dd, VarValues, n );
        Cudd_Ref( TempComb );

        /* make sure that this combination is not already in the set */
        if ( c )
        { /* at least one combination is already included */

            Aux = Cudd_zddDiff( dd, Result, TempComb );
            Cudd_Ref( Aux );
            if ( Aux != Result )
            {
                Cudd_RecursiveDerefZdd( dd, Aux );
                Cudd_RecursiveDerefZdd( dd, TempComb );
                c--;
                continue;
            }
            else 
            { /* Aux is the same node as Result */
                Cudd_Deref( Aux );
            }
        }

        Result = Cudd_zddUnion( dd, Aux = Result, TempComb );
        Cudd_Ref( Result );
        Cudd_RecursiveDerefZdd( dd, Aux );
        Cudd_RecursiveDerefZdd( dd, TempComb );
    }

    ABC_FREE( VarValues );
    Cudd_Deref( Result );
    return Result;

}